

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.cc
# Opt level: O1

int X509_PUBKEY_set(X509_PUBKEY **x,EVP_PKEY *pkey)

{
  int iVar1;
  X509_PUBKEY *val;
  int line;
  uint8_t *spki;
  uint8_t *p;
  size_t spki_len;
  CBB cbb;
  uint8_t *local_58;
  uint8_t *local_50;
  size_t local_48;
  CBB local_40;
  
  local_58 = (uint8_t *)0x0;
  if (x != (X509_PUBKEY **)0x0) {
    iVar1 = CBB_init(&local_40,0);
    if (((iVar1 == 0) || (iVar1 = EVP_marshal_public_key(&local_40,(EVP_PKEY *)pkey), iVar1 == 0))
       || (iVar1 = CBB_finish(&local_40,&local_58,&local_48), (long)local_48 < 0 || iVar1 == 0)) {
      CBB_cleanup(&local_40);
      val = (X509_PUBKEY *)0x0;
      iVar1 = 0x7e;
      line = 0x5e;
    }
    else {
      local_50 = local_58;
      val = (X509_PUBKEY *)
            ASN1_item_d2i((ASN1_VALUE **)0x0,&local_50,local_48,(ASN1_ITEM *)&X509_PUBKEY_it);
      if ((val != (X509_PUBKEY *)0x0) && (local_50 == local_58 + local_48)) {
        OPENSSL_free(local_58);
        ASN1_item_free((ASN1_VALUE *)*x,(ASN1_ITEM *)&X509_PUBKEY_it);
        *x = val;
        return 1;
      }
      iVar1 = 0x7d;
      line = 0x65;
    }
    ERR_put_error(0xb,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_pubkey.cc"
                  ,line);
    ASN1_item_free((ASN1_VALUE *)val,(ASN1_ITEM *)&X509_PUBKEY_it);
    OPENSSL_free(local_58);
  }
  return 0;
}

Assistant:

int X509_PUBKEY_set(X509_PUBKEY **x, EVP_PKEY *pkey) {
  X509_PUBKEY *pk = NULL;
  uint8_t *spki = NULL;
  size_t spki_len;

  if (x == NULL) {
    return 0;
  }

  CBB cbb;
  const uint8_t *p;
  if (!CBB_init(&cbb, 0) ||  //
      !EVP_marshal_public_key(&cbb, pkey) ||
      !CBB_finish(&cbb, &spki, &spki_len) ||  //
      spki_len > LONG_MAX) {
    CBB_cleanup(&cbb);
    OPENSSL_PUT_ERROR(X509, X509_R_PUBLIC_KEY_ENCODE_ERROR);
    goto error;
  }

  p = spki;
  pk = d2i_X509_PUBKEY(NULL, &p, (long)spki_len);
  if (pk == NULL || p != spki + spki_len) {
    OPENSSL_PUT_ERROR(X509, X509_R_PUBLIC_KEY_DECODE_ERROR);
    goto error;
  }

  OPENSSL_free(spki);
  X509_PUBKEY_free(*x);
  *x = pk;

  return 1;
error:
  X509_PUBKEY_free(pk);
  OPENSSL_free(spki);
  return 0;
}